

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O1

void av1_inter_mode_data_init(TileDataEnc *tile_data)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    *(undefined4 *)((long)&tile_data->inter_mode_rd_models[0].ready + lVar2) = 0;
    *(undefined4 *)((long)&tile_data->inter_mode_rd_models[0].num + lVar2) = 0;
    puVar1 = (undefined8 *)((long)&tile_data->inter_mode_rd_models[0].dist_sum + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&tile_data->inter_mode_rd_models[0].sse_sum + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&tile_data->inter_mode_rd_models[0].sse_ld_sum + lVar2) = 0;
    lVar2 = lVar2 + 0x70;
  } while (lVar2 != 0x9a0);
  return;
}

Assistant:

void av1_inter_mode_data_init(TileDataEnc *tile_data) {
  for (int i = 0; i < BLOCK_SIZES_ALL; ++i) {
    InterModeRdModel *md = &tile_data->inter_mode_rd_models[i];
    md->ready = 0;
    md->num = 0;
    md->dist_sum = 0;
    md->ld_sum = 0;
    md->sse_sum = 0;
    md->sse_sse_sum = 0;
    md->sse_ld_sum = 0;
  }
}